

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  pointer pEVar1;
  pointer pcVar2;
  string *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  undefined1 local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  ExceptionFormatValue local_68;
  
  local_c8._0_8_ = local_c8 + 0x10;
  pEVar1 = (values->
           super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  params_00 = params;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pEVar1,
             &((values->
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               )._M_impl.super__Vector_impl_data._M_finish)->type + (long)pEVar1);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            (&local_68,(ExceptionFormatValue *)local_c8,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.str_val._M_dataplus._M_p != &local_68.str_val.field_2) {
    operator_delete(local_68.str_val._M_dataplus._M_p);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_);
  }
  pcVar2 = (param->_M_dataplus)._M_p;
  local_88._0_8_ = (pointer)(local_88 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar2,pcVar2 + param->_M_string_length);
  pcVar2 = (params->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_c8 + 0x20),pcVar2,pcVar2 + params->_M_string_length);
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_c8 + 0x20),params_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}